

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O2

void saveData(void)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  ofstream ignoredUsersFile;
  
  std::ofstream::ofstream((ostream *)&ignoredUsersFile,"data/ignored_users.txt",_S_out);
  for (p_Var2 = ignoredUsers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &ignoredUsers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&ignoredUsersFile,(string *)(p_Var2 + 1));
    std::operator<<(poVar1,"\n");
  }
  std::ofstream::~ofstream(&ignoredUsersFile);
  return;
}

Assistant:

void saveData() {
    std::ofstream ignoredUsersFile("data/ignored_users.txt");
    for (const std::string& ignoredUser : ignoredUsers) {
        ignoredUsersFile << ignoredUser << "\n";
    }
}